

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t
bsc_reduce_root_p_tree_multiple
          (bsc_step_t depends,bsp_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  undefined8 *puVar1;
  int iVar2;
  bsc_step_t bVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  if (group == (bsc_group_t)0x0) {
    iVar2 = bsp_nprocs();
  }
  else {
    iVar2 = *group;
  }
  dVar6 = (double)iVar2;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar6 = ceil(dVar6);
  uVar5 = 0;
  uVar4 = (ulong)(uint)n;
  if (n < 1) {
    uVar4 = uVar5;
  }
  bVar3 = depends;
  for (; uVar4 * 0x30 - uVar5 != 0; uVar5 = uVar5 + 0x30) {
    puVar1 = (undefined8 *)((long)&params->reducer + uVar5);
    bVar3 = bsc_reduce_qtree_single
                      (depends,root,group,*(void **)((long)&params->src + uVar5),
                       *(void **)((long)&params->dst + uVar5),*(void **)((long)&params->tmp + uVar5)
                       ,(bsc_reduce_t)*puVar1,(void *)puVar1[1],
                       *(bsc_size_t *)((long)&params->nmemb + uVar5),
                       *(bsc_size_t *)((long)&params->size + uVar5),(int)dVar6);
  }
  return bVar3;
}

Assistant:

bsc_step_t bsc_reduce_root_p_tree_multiple( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs(), root_P = (bsc_pid_t) ceil(sqrt(P));
    bsc_size_t i;
    bsc_step_t finished = depends;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_reduce_qtree_single( depends, root, group,
                   params[i].src, params[i].dst, params[i].tmp,
                   params[i].reducer, params[i].zero, 
                   params[i].nmemb, params[i].size, root_P );
    }

    return finished;
}